

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gen.pvip.y.c
# Opt level: O3

void yy_2_class_declare(GREG *G,char *yytext,int yyleng,yythunk *thunk,PVIPParserContext yyxvar)

{
  PVIPParserContext *parser;
  PVIPNode *pPVar1;
  PVIPNode *n2;
  PVIPNode **ppPVar2;
  
  parser = &G->data;
  ppPVar2 = G->val;
  pPVar1 = ppPVar2[-3];
  if (pPVar1 == (PVIPNode *)0x0) {
    pPVar1 = PVIP_node_new_children(parser,PVIP_NODE_NOP);
    ppPVar2 = G->val;
  }
  n2 = ppPVar2[-2];
  if (n2 == (PVIPNode *)0x0) {
    n2 = PVIP_node_new_children(parser,PVIP_NODE_NOP);
    ppPVar2 = G->val;
  }
  pPVar1 = PVIP_node_new_children3(parser,PVIP_NODE_CLASS,pPVar1,n2,ppPVar2[-1]);
  G->ss = pPVar1;
  return;
}

Assistant:

YY_ACTION(void) yy_2_class_declare(GREG *G, char *yytext, int yyleng, yythunk *thunk, YY_XTYPE YY_XVAR)
{
#define b G->val[-1]
#define is G->val[-2]
#define i G->val[-3]
  yyprintf((stderr, "do yy_2_class_declare"));
  yyprintfvTcontext(yytext);
  yyprintf((stderr, "\n  {\n\
        yy = PVIP_node_new_children3(&(G->data), \n\
            PVIP_NODE_CLASS,\n\
            MAYBE(i),\n\
            MAYBE(is),\n\
            b\n\
        );\n\
    }\n"));
  
        yy = PVIP_node_new_children3(&(G->data), 
            PVIP_NODE_CLASS,
            MAYBE(i),
            MAYBE(is),
            b
        );
    ;
#undef b
#undef is
#undef i
}